

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ParseJSON2(JSContext *ctx,char *buf,size_t buf_len,char *filename,int flags)

{
  JSValue JVar1;
  int iVar2;
  JSValue JVar3;
  JSValue val;
  JSParseState *s;
  JSParseState s1;
  JSToken *in_stack_ffffffffffffff18;
  JSValueUnion in_stack_ffffffffffffff20;
  JSValueUnion in_stack_ffffffffffffff28;
  JSValueUnion JVar4;
  JSParseState *in_stack_ffffffffffffff58;
  int local_a0;
  undefined4 in_stack_fffffffffffffff0;
  int32_t iVar5;
  undefined4 in_stack_fffffffffffffff4;
  JSValueUnion local_8;
  
  JVar4.float64 = 0.0;
  js_parse_init((JSContext *)0x0,(JSParseState *)in_stack_ffffffffffffff28.ptr,
                (char *)in_stack_ffffffffffffff20.ptr,(size_t)in_stack_ffffffffffffff18,
                (char *)0x14789b);
  iVar2 = json_next_token(in_stack_ffffffffffffff58);
  if (iVar2 == 0) {
    JVar3 = json_parse_value((JSParseState *)
                             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    in_stack_ffffffffffffff20 = JVar3.u;
    local_8 = (JSValueUnion)JVar3.tag;
    in_stack_ffffffffffffff28 = local_8;
    JVar4 = in_stack_ffffffffffffff20;
    iVar2 = JS_IsException(JVar3);
    if ((iVar2 == 0) &&
       ((local_a0 == -0x56 ||
        (iVar2 = js_parse_error((JSParseState *)&stack0xffffffffffffff48,
                                "unexpected data at the end"), iVar2 == 0)))) {
      iVar5 = JVar4.int32;
      in_stack_fffffffffffffff4 = JVar4._4_4_;
      goto LAB_0014798e;
    }
  }
  JVar3.tag = (int64_t)JVar4.ptr;
  JVar3.u.ptr = in_stack_ffffffffffffff28.ptr;
  JS_FreeValue((JSContext *)in_stack_ffffffffffffff20.ptr,JVar3);
  free_token((JSParseState *)in_stack_ffffffffffffff20.ptr,in_stack_ffffffffffffff18);
  iVar5 = 0;
  local_8.float64 = 2.96439387504748e-323;
LAB_0014798e:
  JVar1.u._4_4_ = in_stack_fffffffffffffff4;
  JVar1.u.int32 = iVar5;
  JVar1.tag = (int64_t)local_8.ptr;
  return JVar1;
}

Assistant:

JSValue JS_ParseJSON2(JSContext *ctx, const char *buf, size_t buf_len,
                      const char *filename, int flags)
{
    JSParseState s1, *s = &s1;
    JSValue val = JS_UNDEFINED;

    js_parse_init(ctx, s, buf, buf_len, filename);
    s->ext_json = ((flags & JS_PARSE_JSON_EXT) != 0);
    if (json_next_token(s))
        goto fail;
    val = json_parse_value(s);
    if (JS_IsException(val))
        goto fail;
    if (s->token.val != TOK_EOF) {
        if (js_parse_error(s, "unexpected data at the end"))
            goto fail;
    }
    return val;
 fail:
    JS_FreeValue(ctx, val);
    free_token(s, &s->token);
    return JS_EXCEPTION;
}